

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

void __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::DeleteString
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pString)

{
  TNamesDepend *this_00;
  const_iterator __position;
  
  if ((a_pString < this->m_pData) || (this->m_pData + this->m_uDataLen <= a_pString)) {
    this_00 = &this->m_strings;
    __position._M_node = (_List_node_base *)this_00;
    while (__position._M_node = (__position._M_node)->_M_next,
          __position._M_node != (_List_node_base *)this_00) {
      if (__position._M_node[1]._M_next == (_List_node_base *)a_pString) {
        if (a_pString != (char *)0x0) {
          operator_delete__(__position._M_node[1]._M_next);
        }
        std::__cxx11::
        list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ::erase(this_00,__position);
        return;
      }
    }
  }
  return;
}

Assistant:

void
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::DeleteString(
    const SI_CHAR * a_pString
    )
{
    // strings may exist either inside the data block, or they will be
    // individually allocated and stored in m_strings. We only physically
    // delete those stored in m_strings.
    if (a_pString < m_pData || a_pString >= m_pData + m_uDataLen) {
        typename TNamesDepend::iterator i = m_strings.begin();
        for (;i != m_strings.end(); ++i) {
            if (a_pString == i->pItem) {
                delete[] const_cast<SI_CHAR*>(i->pItem);
                m_strings.erase(i);
                break;
            }
        }
    }
}